

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

bool amrex::VisMF::Exist(string *mf_name)

{
  bool bVar1;
  string FullHdrFileName;
  ifstream iss;
  int aiStack_1f0 [122];
  
  std::operator+(&FullHdrFileName,mf_name,"_H");
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::ifstream::ifstream(&iss);
    std::ifstream::open((char *)&iss,(_Ios_Openmode)FullHdrFileName._M_dataplus._M_p);
    bVar1 = *(int *)((long)aiStack_1f0 + *(long *)(_iss + -0x18)) == 0;
    std::ifstream::~ifstream(&iss);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&FullHdrFileName);
  return bVar1;
}

Assistant:

bool
VisMF::Exist (const std::string& mf_name)
{
    std::string FullHdrFileName(mf_name + TheMultiFabHdrFileSuffix);
    int exist = 0;
    if (ParallelDescriptor::IOProcessor()) {
        std::ifstream iss;
        iss.open(FullHdrFileName.c_str(), std::ios::in);
        exist = iss.good();
    }
    ParallelDescriptor::Bcast(&exist, 1, ParallelDescriptor::IOProcessorNumber());
    return exist;
}